

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

bool P_ActivateThingSpecial(AActor *thing,AActor *trigger,bool death)

{
  uint uVar1;
  int iVar2;
  AActor *activator;
  bool bVar3;
  
  uVar1 = thing->activationtype;
  if ((uVar1 & 2) != 0) {
    (thing->target).field_0.p = trigger;
  }
  if ((uVar1 & 4) != 0) {
    (trigger->target).field_0.p = thing;
  }
  if ((death) || (uVar1 = thing->activationtype, (uVar1 & 0x700) == 0)) {
LAB_0040abcc:
    bVar3 = false;
  }
  else {
    if ((uVar1 & 0x700) == 0x400) {
      thing->activationtype = uVar1 | 0x100;
    }
    uVar1 = thing->activationtype;
    if ((uVar1 >> 8 & 1) == 0) {
      if ((uVar1 >> 9 & 1) == 0) goto LAB_0040abcc;
      thing->activationtype = uVar1 >> 2 & 0x100 | uVar1 & 0xfffffcff;
      AActor::CallDeactivate(thing,trigger);
    }
    else {
      thing->activationtype = uVar1 >> 1 & 0x200 | uVar1 & 0xfffffeff;
      AActor::CallActivate(thing,trigger);
    }
    bVar3 = true;
  }
  if (thing->special != 0) {
    if ((((!death) || ((level.flags._1_1_ & 8) == 0)) ||
        (activator = thing, (thing->activationtype & 0x80) != 0)) &&
       (activator = trigger, (thing->activationtype & 1) != 0)) {
      activator = thing;
    }
    iVar2 = P_ExecuteSpecial(thing->special,(line_t *)0x0,activator,false,thing->args[0],
                             thing->args[1],thing->args[2],thing->args[3],thing->args[4]);
    bVar3 = iVar2 != 0;
    if ((death) || ((iVar2 != 0 && ((thing->activationtype & 0x20U) != 0)))) {
      thing->special = 0;
    }
  }
  return bVar3;
}

Assistant:

bool P_ActivateThingSpecial(AActor * thing, AActor * trigger, bool death)
{
	bool res = false;

	// Target switching mechanism
	if (thing->activationtype & THINGSPEC_ThingTargets)		thing->target = trigger;
	if (thing->activationtype & THINGSPEC_TriggerTargets)	trigger->target = thing;

	// State change mechanism. The thing needs to be not dead and to have at least one of the relevant flags
	if (!death && (thing->activationtype & (THINGSPEC_Activate | THINGSPEC_Deactivate | THINGSPEC_Switch)))
	{
		// If a switchable thing does not know whether it should be activated
		// or deactivated, the default is to activate it.
		if ((thing->activationtype & THINGSPEC_Switch)
			&& !(thing->activationtype & (THINGSPEC_Activate | THINGSPEC_Deactivate)))
		{
			thing->activationtype |= THINGSPEC_Activate;
		}
		// Can it be activated?
		if (thing->activationtype & THINGSPEC_Activate)
		{
			thing->activationtype &= ~THINGSPEC_Activate; // Clear flag
			if (thing->activationtype & THINGSPEC_Switch) // Set other flag if switching
				thing->activationtype |= THINGSPEC_Deactivate;
			thing->CallActivate(trigger);
			res = true;
		}
		// If not, can it be deactivated?
		else if (thing->activationtype & THINGSPEC_Deactivate)
		{
			thing->activationtype &= ~THINGSPEC_Deactivate; // Clear flag
			if (thing->activationtype & THINGSPEC_Switch)	// Set other flag if switching
				thing->activationtype |= THINGSPEC_Activate;
			thing->CallDeactivate(trigger);
			res = true;
		}
	}

	// Run the special, if any
	if (thing->special)
	{
		res = !!P_ExecuteSpecial(thing->special, NULL,
			// TriggerActs overrides the level flag, which only concerns thing activated by death
			(((death && level.flags & LEVEL_ACTOWNSPECIAL && !(thing->activationtype & THINGSPEC_TriggerActs))
			|| (thing->activationtype & THINGSPEC_ThingActs)) // Who triggers?
			? thing : trigger),
			false, thing->args[0], thing->args[1], thing->args[2], thing->args[3], thing->args[4]);

		// Clears the special if it was run on thing's death or if flag is set.
		if (death || (thing->activationtype & THINGSPEC_ClearSpecial && res)) thing->special = 0;
	}

	// Returns the result
	return res;
}